

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_RoundTrip.c
# Opt level: O3

WJTL_STATUS TestParseJson1AndOutput(void)

{
  WJTL_STATUS WVar1;
  JL_STATUS JVar2;
  int iVar3;
  JL_STATUS JVar4;
  JL_STATUS JVar5;
  JL_STATUS JVar6;
  int iVar7;
  JL_STATUS JVar8;
  WJTL_STATUS WVar9;
  JlDataObject *objectTree;
  char *outputJson;
  size_t errorPos;
  char inputJson [282];
  JlDataObject *local_170;
  char *local_168;
  size_t local_160;
  char local_158 [296];
  
  local_170 = (JlDataObject *)0x0;
  local_168 = (char *)0x0;
  local_160 = 0;
  memcpy(local_158,
         "{ \"Key1\": \"Value1\", \"Key2\" : \"Value2\", \"Key3\":[1,2,3 ,4 , 5  ,6,7],\n  \"Key4\" : { \"SubKey1\" : true, \"SubKey2\":false, \"SubKey3\":null }, \n  \"Key5\":{ \"a\":1000, \"b\":2000.5, \"c\":-3000, \"d\":-4e123 },\n  \"Key6\":{ \"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,\"\",{\"a\":0}], \"b\":{\"c\":1,\"d\":2} } }\n"
         ,0x11a);
  WVar1 = JlParseJsonEx(local_158,false,&local_170,&local_160);
  WVar9 = WVar1;
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    WVar9 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( inputJson, 0, &objectTree, &errorPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                   ,"TestParseJson1AndOutput",0x3f);
  if (local_170 != (JlDataObject *)0x0) {
    JVar2 = JlOutputJson(local_170,false,&local_168);
    WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlOutputJson( objectTree, 0, &outputJson ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                     ,"TestParseJson1AndOutput",0x43);
    iVar3 = strcmp(local_168,
                   "{\"Key1\":\"Value1\",\"Key2\":\"Value2\",\"Key3\":[1,2,3,4,5,6,7],\"Key4\":{\"SubKey1\":true,\"SubKey2\":false,\"SubKey3\":null},\"Key5\":{\"a\":1000,\"b\":2000.5,\"c\":-3000,\"d\":-4e+123},\"Key6\":{\"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,null,{\"a\":0}],\"b\":{\"c\":1,\"d\":2}}}"
                  );
    WjTestLib_Assert(iVar3 == 0,
                     "strcmp( outputJson, \"{\\\"Key1\\\":\\\"Value1\\\",\\\"Key2\\\":\\\"Value2\\\",\\\"Key3\\\":[1,2,3,4,5,6,7],\" \"\\\"Key4\\\":{\\\"SubKey1\\\":true,\\\"SubKey2\\\":false,\\\"SubKey3\\\":null},\" \"\\\"Key5\\\":{\\\"a\\\":1000,\\\"b\\\":2000.5,\\\"c\\\":-3000,\\\"d\\\":-4e+123},\" \"\\\"Key6\\\":{\\\"a\\\":[\\\"aa\\\",\\\"bb\\\",true,false,1,2,3,4,-5,null,null,{\\\"a\\\":0}],\\\"b\\\":{\\\"c\\\":1,\\\"d\\\":2}}}\" ) == 0"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                     ,"TestParseJson1AndOutput",0x48);
    JVar4 = JlFreeObjectTree(&local_170);
    WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                     ,"TestParseJson1AndOutput",0x4a);
    JVar5 = JlFreeJsonStringBuffer(&local_168);
    WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeJsonStringBuffer( &outputJson ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                     ,"TestParseJson1AndOutput",0x4b);
    JVar6 = JlParseJsonEx(local_158,true,&local_170,&local_160);
    WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlParseJsonEx( inputJson, 1, &objectTree, &errorPos ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                     ,"TestParseJson1AndOutput",0x4e);
    if (((JVar4 != JL_STATUS_SUCCESS || JVar5 != JL_STATUS_SUCCESS) ||
        (iVar3 != 0 || JVar2 != JL_STATUS_SUCCESS)) || JVar6 != JL_STATUS_SUCCESS) {
      WVar9 = WJTL_STATUS_FAILED;
    }
    if (local_170 != (JlDataObject *)0x0) {
      JVar2 = JlOutputJson(local_170,false,&local_168);
      WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlOutputJson( objectTree, 0, &outputJson ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x52);
      iVar3 = strcmp(local_168,
                     "{\"Key1\":\"Value1\",\"Key2\":\"Value2\",\"Key3\":[1,2,3,4,5,6,7],\"Key4\":{\"SubKey1\":true,\"SubKey2\":false,\"SubKey3\":null},\"Key5\":{\"a\":1000,\"b\":2000.5,\"c\":-3000,\"d\":-4e+123},\"Key6\":{\"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,null,{\"a\":0}],\"b\":{\"c\":1,\"d\":2}}}"
                    );
      WjTestLib_Assert(iVar3 == 0,
                       "strcmp( outputJson, \"{\\\"Key1\\\":\\\"Value1\\\",\\\"Key2\\\":\\\"Value2\\\",\\\"Key3\\\":[1,2,3,4,5,6,7],\" \"\\\"Key4\\\":{\\\"SubKey1\\\":true,\\\"SubKey2\\\":false,\\\"SubKey3\\\":null},\" \"\\\"Key5\\\":{\\\"a\\\":1000,\\\"b\\\":2000.5,\\\"c\\\":-3000,\\\"d\\\":-4e+123},\" \"\\\"Key6\\\":{\\\"a\\\":[\\\"aa\\\",\\\"bb\\\",true,false,1,2,3,4,-5,null,null,{\\\"a\\\":0}],\\\"b\\\":{\\\"c\\\":1,\\\"d\\\":2}}}\" ) == 0"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x57);
      JVar4 = JlFreeJsonStringBuffer(&local_168);
      WjTestLib_Assert(JVar4 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlFreeJsonStringBuffer( &outputJson ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x59);
      JVar5 = JlOutputJson(local_170,true,&local_168);
      WjTestLib_Assert(JVar5 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlOutputJson( objectTree, 1, &outputJson ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x5c);
      iVar7 = strcmp(local_168,
                     "{\n    \"Key1\": \"Value1\",\n    \"Key2\": \"Value2\",\n    \"Key3\": [\n        1,\n        2,\n        3,\n        4,\n        5,\n        6,\n        7\n    ],\n    \"Key4\": {\n        \"SubKey1\": true,\n        \"SubKey2\": false,\n        \"SubKey3\": null\n    },\n    \"Key5\": {\n        \"a\": 1000,\n        \"b\": 2000.5,\n        \"c\": -3000,\n        \"d\": -4e+123\n    },\n    \"Key6\": {\n        \"a\": [\n            \"aa\",\n            \"bb\",\n            true,\n            false,\n            1,\n            2,\n            3,\n            4,\n            -5,\n            null,\n            null,\n            {\n                \"a\": 0\n            }\n        ],\n        \"b\": {\n            \"c\": 1,\n            \"d\": 2\n        }\n    }\n}\n"
                    );
      WjTestLib_Assert(iVar7 == 0,
                       "strcmp( outputJson, \"{\\n\" \"    \\\"Key1\\\": \\\"Value1\\\",\\n\" \"    \\\"Key2\\\": \\\"Value2\\\",\\n\" \"    \\\"Key3\\\": [\\n\" \"        1,\\n\" \"        2,\\n\" \"        3,\\n\" \"        4,\\n\" \"        5,\\n\" \"        6,\\n\" \"        7\\n\" \"    ],\\n\" \"    \\\"Key4\\\": {\\n\" \"        \\\"SubKey1\\\": true,\\n\" \"        \\\"SubKey2\\\": false,\\n\" \"        \\\"SubKey3\\\": null\\n\" \"    },\\n\" \"    \\\"Key5\\\": {\\n\" \"        \\\"a\\\": 1000,\\n\" \"        \\\"b\\\": 2000.5,\\n\" \"        \\\"c\\\": -3000,\\n\" \"        \\\"d\\\": -4e+123\\n\" \"    },\\n\" \"    \\\"Key6\\\": {\\n\" \"        \\\"a\\\": [\\n\" \"            \\\"aa\\\",\\n\" \"            \\\"bb\\\",\\n\" \"            true,\\n\" \"            false,\\n\" \"            1,\\n\" \"            2,\\n\" \"            3,\\n\" \"            4,\\n\" \"            -5,\\n\" \"            null,\\n\" \"            null,\\n\" \"            {\\n\" \"                \\\"a\\\": 0\\n\" \"            }\\n\" \"        ],\\n\" \"        \\\"b\\\": {\\n\" \"            \\\"c\\\": 1,\\n\" \"            \\\"d\\\": 2\\n\" \"        }\\n\" \"    }\\n\" \"}\\n\" ) == 0"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x8b);
      JVar6 = JlFreeObjectTree(&local_170);
      WjTestLib_Assert(JVar6 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlFreeObjectTree( &objectTree ))) == (JL_STATUS_SUCCESS)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x8d);
      JVar8 = JlFreeJsonStringBuffer(&local_168);
      WjTestLib_Assert(JVar8 == JL_STATUS_SUCCESS,
                       "((JL_STATUS)(JlFreeJsonStringBuffer( &outputJson ))) == (JL_STATUS_SUCCESS)"
                       ,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_RoundTrip.c"
                       ,"TestParseJson1AndOutput",0x8e);
      if (((iVar7 != 0 || JVar6 != JL_STATUS_SUCCESS) ||
          ((JVar4 != JL_STATUS_SUCCESS || JVar5 != JL_STATUS_SUCCESS) ||
          (iVar3 != 0 || JVar2 != JL_STATUS_SUCCESS))) || JVar8 != JL_STATUS_SUCCESS) {
        WVar9 = WJTL_STATUS_FAILED;
      }
    }
  }
  return WVar9;
}

Assistant:

static
WJTL_STATUS
    TestParseJson1AndOutput
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    JlDataObject* objectTree = NULL;
    char* outputJson = NULL;
    size_t errorPos = 0;

    const char inputJson[] =
        "{ \"Key1\": \"Value1\", \"Key2\" : \"Value2\", \"Key3\":[1,2,3 ,4 , 5  ,6,7],\n"
        "  \"Key4\" : { \"SubKey1\" : true, \"SubKey2\":false, \"SubKey3\":null }, \n"
        "  \"Key5\":{ \"a\":1000, \"b\":2000.5, \"c\":-3000, \"d\":-4e123 },\n"
        "  \"Key6\":{ \"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,\"\",{\"a\":0}], \"b\":{\"c\":1,\"d\":2} } }\n";

    // Parse as Json1
    JL_ASSERT_SUCCESS( JlParseJsonEx( inputJson, false, &objectTree, &errorPos ) );
    if( NULL == objectTree ) { return TestReturn; }

    // Output as Json1, no formatting
    JL_ASSERT_SUCCESS( JlOutputJson( objectTree, false, &outputJson ) );
    JL_ASSERT( strcmp( outputJson,
        "{\"Key1\":\"Value1\",\"Key2\":\"Value2\",\"Key3\":[1,2,3,4,5,6,7],"
        "\"Key4\":{\"SubKey1\":true,\"SubKey2\":false,\"SubKey3\":null},"
        "\"Key5\":{\"a\":1000,\"b\":2000.5,\"c\":-3000,\"d\":-4e+123},"
        "\"Key6\":{\"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,null,{\"a\":0}],\"b\":{\"c\":1,\"d\":2}}}" ) == 0 );

    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );
    JL_ASSERT_SUCCESS( JlFreeJsonStringBuffer( &outputJson ) );

    // Parse as Json5
    JL_ASSERT_SUCCESS( JlParseJsonEx( inputJson, true, &objectTree, &errorPos ) );
    if( NULL == objectTree ) { return TestReturn; }

    // Output as Json1, no formatting
    JL_ASSERT_SUCCESS( JlOutputJson( objectTree, false, &outputJson ) );
    JL_ASSERT( strcmp( outputJson,
        "{\"Key1\":\"Value1\",\"Key2\":\"Value2\",\"Key3\":[1,2,3,4,5,6,7],"
        "\"Key4\":{\"SubKey1\":true,\"SubKey2\":false,\"SubKey3\":null},"
        "\"Key5\":{\"a\":1000,\"b\":2000.5,\"c\":-3000,\"d\":-4e+123},"
        "\"Key6\":{\"a\":[\"aa\",\"bb\",true,false,1,2,3,4,-5,null,null,{\"a\":0}],\"b\":{\"c\":1,\"d\":2}}}" ) == 0 );

    JL_ASSERT_SUCCESS( JlFreeJsonStringBuffer( &outputJson ) );

    // Output as Json1, with indenting formatting
    JL_ASSERT_SUCCESS( JlOutputJson( objectTree, true, &outputJson ) );
    JL_ASSERT( strcmp( outputJson,
        "{\n"
        "    \"Key1\": \"Value1\",\n"
        "    \"Key2\": \"Value2\",\n"
        "    \"Key3\": [\n"
        "        1,\n"
        "        2,\n"
        "        3,\n"
        "        4,\n"
        "        5,\n"
        "        6,\n"
        "        7\n"
        "    ],\n"
        "    \"Key4\": {\n"
        "        \"SubKey1\": true,\n"
        "        \"SubKey2\": false,\n"
        "        \"SubKey3\": null\n"
        "    },\n"
        "    \"Key5\": {\n"
        "        \"a\": 1000,\n"
        "        \"b\": 2000.5,\n"
        "        \"c\": -3000,\n"
        "        \"d\": -4e+123\n"
        "    },\n"
        "    \"Key6\": {\n"
        "        \"a\": [\n"
        "            \"aa\",\n"
        "            \"bb\",\n"
        "            true,\n"
        "            false,\n"
        "            1,\n"
        "            2,\n"
        "            3,\n"
        "            4,\n"
        "            -5,\n"
        "            null,\n"
        "            null,\n"
        "            {\n"
        "                \"a\": 0\n"
        "            }\n"
        "        ],\n"
        "        \"b\": {\n"
        "            \"c\": 1,\n"
        "            \"d\": 2\n"
        "        }\n"
        "    }\n"
        "}\n" ) == 0 );

    JL_ASSERT_SUCCESS( JlFreeObjectTree( &objectTree ) );
    JL_ASSERT_SUCCESS( JlFreeJsonStringBuffer( &outputJson ) );

    return TestReturn;
}